

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O3

optional<NetAction> s_try_recv<NetAction>(socket_t *socket)

{
  ulong unaff_RBP;
  ulong uVar1;
  NetAction val;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  uint local_54;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  bool local_30;
  
  s_recv_raw_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,socket);
  if (local_30 == true) {
    uVar1 = 0x100000000;
    local_54 = 0;
    memcpy(&local_54,(void *)local_50._M_value._M_dataplus._M_p,local_50._M_value._M_string_length);
    unaff_RBP = (ulong)local_54;
    local_30 = false;
    if (local_50._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_50._M_value + 0x10)) {
      operator_delete((void *)local_50._M_value._M_dataplus._M_p,local_50._16_8_ + 1);
    }
  }
  else {
    uVar1 = 0;
  }
  return (optional<NetAction>)(unaff_RBP & 0xffffffff | uVar1);
}

Assistant:

std::optional<T> s_try_recv(zmq::socket_t *socket) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    auto response{s_recv_raw(socket)};
    if (!response.has_value()) {
        return std::nullopt;
    }

    T val{};
    assert(sizeof(T) == response->size());
    ::memcpy(&val, response->data(), response->size());
    return val;
}